

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::ConstructComment_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmCustomCommandGenerator *ccg,
          char *default_comment)

{
  bool bVar1;
  char *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  reference source;
  allocator local_79;
  string local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  const_iterator o;
  char *sep;
  allocator local_29;
  char *local_28;
  char *default_comment_local;
  cmCustomCommandGenerator *ccg_local;
  cmLocalGenerator *this_local;
  string *comment;
  
  local_28 = default_comment;
  default_comment_local = (char *)ccg;
  ccg_local = (cmCustomCommandGenerator *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  pcVar2 = cmCustomCommandGenerator::GetComment(ccg);
  if (pcVar2 == (char *)0x0) {
    pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                       ((cmCustomCommandGenerator *)default_comment_local);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(pvVar3);
    pcVar2 = local_28;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_79);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Generating ");
      o._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x91b98f;
      pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                         ((cmCustomCommandGenerator *)default_comment_local);
      local_50._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar3);
      while( true ) {
        pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                           ((cmCustomCommandGenerator *)default_comment_local);
        local_58._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar3);
        bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
        if (!bVar1) break;
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)o._M_current);
        source = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_50);
        cmOutputConverter::Convert
                  (&local_78,&this->super_cmOutputConverter,source,START_OUTPUT,UNCHANGED);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        o._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8f2b34
        ;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_50);
      }
    }
  }
  else {
    pcVar2 = cmCustomCommandGenerator::GetComment((cmCustomCommandGenerator *)default_comment_local)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmLocalGenerator::ConstructComment(cmCustomCommandGenerator const& ccg,
                                   const char* default_comment)
{
  // Check for a comment provided with the command.
  if(ccg.GetComment())
    {
    return ccg.GetComment();
    }

  // Construct a reasonable default comment if possible.
  if(!ccg.GetOutputs().empty())
    {
    std::string comment;
    comment = "Generating ";
    const char* sep = "";
    for(std::vector<std::string>::const_iterator o = ccg.GetOutputs().begin();
        o != ccg.GetOutputs().end(); ++o)
      {
      comment += sep;
      comment += this->Convert(*o, cmLocalGenerator::START_OUTPUT);
      sep = ", ";
      }
    return comment;
    }

  // Otherwise use the provided default.
  return default_comment;
}